

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonASTNode.hpp
# Opt level: O0

void __thiscall CommonASTNode::~CommonASTNode(CommonASTNode *this)

{
  CommonASTNode *in_RDI;
  
  ~CommonASTNode(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~CommonASTNode()
		{}